

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::SocketWriter::Send(SocketWriter *this,string *message)

{
  int __fd;
  bool bVar1;
  ostream *poVar2;
  void *__buf;
  ssize_t sVar3;
  GTestLog local_34;
  int local_30;
  int len;
  GTestLog local_1c;
  string *local_18;
  string *message_local;
  SocketWriter *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  bVar1 = IsTrue(this->sockfd_ != -1);
  if (!bVar1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/gtest/googletest/src/gtest-internal-inl.h"
                       ,0x42d);
    poVar2 = GTestLog::GetStream(&local_1c);
    poVar2 = std::operator<<(poVar2,"Condition sockfd_ != -1 failed. ");
    std::operator<<(poVar2,"Send() can be called only when there is a connection.");
    GTestLog::~GTestLog(&local_1c);
  }
  local_30 = std::__cxx11::string::length();
  __fd = this->sockfd_;
  __buf = (void *)std::__cxx11::string::c_str();
  sVar3 = write(__fd,__buf,(long)local_30);
  if (sVar3 != local_30) {
    GTestLog::GTestLog(&local_34,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/gtest/googletest/src/gtest-internal-inl.h"
                       ,0x432);
    poVar2 = GTestLog::GetStream(&local_34);
    poVar2 = std::operator<<(poVar2,"stream_result_to: failed to stream to ");
    poVar2 = std::operator<<(poVar2,(string *)&this->host_name_);
    poVar2 = std::operator<<(poVar2,":");
    std::operator<<(poVar2,(string *)&this->port_num_);
    GTestLog::~GTestLog(&local_34);
  }
  return;
}

Assistant:

virtual void Send(const std::string& message) {
      GTEST_CHECK_(sockfd_ != -1)
          << "Send() can be called only when there is a connection.";

      const int len = static_cast<int>(message.length());
      if (write(sockfd_, message.c_str(), len) != len) {
        GTEST_LOG_(WARNING)
            << "stream_result_to: failed to stream to "
            << host_name_ << ":" << port_num_;
      }
    }